

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int luaL_newmetatable(lua_State *L,char *tname)

{
  int iVar1;
  char *tname_local;
  lua_State *L_local;
  
  lua_getfield(L,-10000,tname);
  iVar1 = lua_type(L,-1);
  if (iVar1 == 0) {
    lua_settop(L,-2);
    lua_createtable(L,0,0);
    lua_pushvalue(L,-1);
    lua_setfield(L,-10000,tname);
  }
  L_local._4_4_ = (uint)(iVar1 == 0);
  return L_local._4_4_;
}

Assistant:

static int luaL_newmetatable(lua_State*L,const char*tname){
lua_getfield(L,(-10000),tname);
if(!lua_isnil(L,-1))
return 0;
lua_pop(L,1);
lua_newtable(L);
lua_pushvalue(L,-1);
lua_setfield(L,(-10000),tname);
return 1;
}